

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O2

double dtl_sv_to_dbl(dtl_sv_t *self,_Bool *ok)

{
  int64_t iVar1;
  _Bool _Var2;
  double dVar3;
  
  dVar3 = 0.0;
  if (self == (dtl_sv_t *)0x0) {
switchD_0013bbeb_default:
    _Var2 = false;
  }
  else {
    switch(self->u32Flags >> 4 & 0xf) {
    case 1:
      dVar3 = (double)(self->pAny->val).i32;
      break;
    case 2:
      dVar3 = (double)(self->pAny->val).u32;
      break;
    case 3:
      dVar3 = (double)(self->pAny->val).i64;
      break;
    case 4:
      iVar1 = (self->pAny->val).i64;
      dVar3 = ((double)CONCAT44(0x45300000,(int)((ulong)iVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
      break;
    case 5:
      dVar3 = (double)(self->pAny->val).flt;
      break;
    case 6:
      dVar3 = (double)(self->pAny->val).i64;
      break;
    case 7:
    case 8:
      dVar3 = (double)(int)(self->pAny->val).cr;
      break;
    default:
      goto switchD_0013bbeb_default;
    }
    _Var2 = true;
  }
  if (ok != (_Bool *)0x0) {
    *ok = _Var2;
  }
  return dVar3;
}

Assistant:

double dtl_sv_to_dbl(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   double retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self))
      {
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         retval = (double) self->pAny->val.i32;
         success = true;
         break;
      case DTL_SV_U32:
         retval = (double) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_FLT:
         retval = (double) self->pAny->val.flt;
         success = true;
         break;
      case DTL_SV_I64:
         retval = (double) self->pAny->val.i64;
         success = true;
         break;
      case DTL_SV_U64:
         retval = (double) self->pAny->val.u64;
         success = true;
         break;
      case DTL_SV_DBL:
         retval = self->pAny->val.dbl;
         success = true;
         break;
      case DTL_SV_BOOL:
         retval = (double) self->pAny->val.bl;
         success = true;
         break;
      case DTL_SV_CHAR:
         retval = (double)self->pAny->val.cr;
         success = true;
         break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}